

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_basic.hpp
# Opt level: O1

void __thiscall
lest::message::message(message *this,text *kind_,location *where_,text *expr_,text *note_)

{
  pointer pcVar1;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)expr_);
  *(undefined ***)this = &PTR__message_0012d8e8;
  (this->kind)._M_dataplus._M_p = (pointer)&(this->kind).field_2;
  pcVar1 = (kind_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->kind,pcVar1,pcVar1 + kind_->_M_string_length);
  (this->where).file._M_dataplus._M_p = (pointer)&(this->where).file.field_2;
  pcVar1 = (where_->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->where,pcVar1,pcVar1 + (where_->file)._M_string_length);
  (this->where).line = where_->line;
  pcVar1 = (note_->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + note_->_M_string_length);
  (this->note).info._M_dataplus._M_p = (pointer)&(this->note).info.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this->note,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

message( text kind_, location where_, text expr_, text note_ = "" )
    : std::runtime_error( expr_), kind( kind_), where( where_), note( note_) {}